

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *rpaths)

{
  string *psVar1;
  pointer pcVar2;
  cmRuntimeDependencyArchive *this_00;
  string *psVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  cmUVProcessChainBuilder *this_01;
  istream *piVar7;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  cmUVProcessChain process;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  RegularExpressionMatch pathMatch;
  ostringstream e;
  cmUVProcessChainBuilder builder;
  string local_308;
  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool *local_2e8;
  undefined1 local_2e0 [8];
  StdioConfiguration local_2d8;
  StdioConfiguration local_2d0;
  undefined1 local_2c8;
  undefined7 uStack_2c7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_298 [80];
  char *local_248;
  char *local_240;
  char *local_1f8;
  string *local_1f0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1e8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1e0;
  undefined1 local_1d8 [80];
  char *local_188;
  ios_base local_168 [48];
  char *local_138;
  cmUVProcessChainBuilder local_60;
  
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool).Archive;
  pcVar2 = local_1d8 + 0x10;
  local_2e8 = &this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool;
  local_1e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)libs;
  local_1d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"otool","");
  bVar4 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)local_1d8,&local_2b8);
  if ((pointer)local_1d8._0_8_ != pcVar2) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  if (bVar4) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
               (char (*) [3])0x565821);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,file)
    ;
    cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_60);
    this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&local_60,Stream_OUTPUT);
    cmUVProcessChainBuilder::AddCommand(this_01,&local_2b8);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_2e0);
    bVar4 = cmUVProcessChain::Valid((cmUVProcessChain *)local_2e0);
    if (bVar4) {
      local_2d8 = (StdioConfiguration)((long)local_2e0 + 0x18);
      local_2d0.Type = None;
      local_2d0.FileDescriptor = 0;
      local_2c8 = 0;
      local_1f0 = file;
      local_1e8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rpaths;
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::rpathRegex == '\0') &&
         (iVar6 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::rpathRegex), iVar6 != 0)) {
        GetFileInfo::rpathRegex.regmatch.startp[0] = (char *)0x0;
        GetFileInfo::rpathRegex.regmatch.endp[0] = (char *)0x0;
        GetFileInfo::rpathRegex.regmatch.searchstring = (char *)0x0;
        GetFileInfo::rpathRegex.program = (char *)0x0;
        cmsys::RegularExpression::compile(&GetFileInfo::rpathRegex,"^ *cmd LC_RPATH$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::rpathRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::loadDylibRegex == '\0') &&
         (iVar6 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::loadDylibRegex), iVar6 != 0)) {
        GetFileInfo::loadDylibRegex.regmatch.startp[0] = (char *)0x0;
        GetFileInfo::loadDylibRegex.regmatch.endp[0] = (char *)0x0;
        GetFileInfo::loadDylibRegex.regmatch.searchstring = (char *)0x0;
        GetFileInfo::loadDylibRegex.program = (char *)0x0;
        cmsys::RegularExpression::compile(&GetFileInfo::loadDylibRegex,"^ *cmd LC_LOAD_DYLIB$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::loadDylibRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::loadDylibRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::pathRegex == '\0') &&
         (iVar6 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::pathRegex), iVar6 != 0)) {
        GetFileInfo::pathRegex.regmatch.startp[0] = (char *)0x0;
        GetFileInfo::pathRegex.regmatch.endp[0] = (char *)0x0;
        GetFileInfo::pathRegex.regmatch.searchstring = (char *)0x0;
        GetFileInfo::pathRegex.program = (char *)0x0;
        cmsys::RegularExpression::compile
                  (&GetFileInfo::pathRegex,"^ *path (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::pathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::pathRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::nameRegex == '\0') &&
         (iVar6 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::nameRegex), iVar6 != 0)) {
        GetFileInfo::nameRegex.regmatch.startp[0] = (char *)0x0;
        GetFileInfo::nameRegex.regmatch.endp[0] = (char *)0x0;
        GetFileInfo::nameRegex.regmatch.searchstring = (char *)0x0;
        GetFileInfo::nameRegex.program = (char *)0x0;
        cmsys::RegularExpression::compile
                  (&GetFileInfo::nameRegex,"^ *name (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::nameRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::nameRegex);
      }
      psVar1 = (string *)(local_2e0 + 8);
      do {
        do {
          piVar7 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
          cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar7 + -0x18) + (char)piVar7);
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (piVar7,psVar1,cVar5);
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
            bVar4 = cmUVProcessChain::Wait((cmUVProcessChain *)local_2e0,-1);
            psVar3 = local_1f0;
            if (bVar4) {
              cmUVProcessChain::GetStatus
                        ((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                          *)&local_308,(cmUVProcessChain *)local_2e0);
              if ((*(long **)local_308._M_dataplus._M_p == (long *)0x0) ||
                 (**(long **)local_308._M_dataplus._M_p != 0)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,"Failed to run otool on:\n  ",0x1a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length)
                ;
                std::__cxx11::stringbuf::str();
                cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                          (local_2e8,(string *)local_298);
                if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                  operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
                std::ios_base::~ios_base(local_168);
                bVar4 = false;
              }
              else {
                bVar4 = true;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_308._M_dataplus._M_p,
                                CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                                         local_308.field_2._M_local_buf[0]) -
                                (long)local_308._M_dataplus._M_p);
              }
              goto LAB_003bc3f7;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,"Failed to wait on otool process for:\n  ",0x27);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
            std::__cxx11::stringbuf::str();
            cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_298);
            if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
            std::ios_base::~ios_base(local_168);
            goto LAB_003bc3f5;
          }
          local_1d8._0_8_ = (pointer)0x0;
          local_188 = (char *)0x0;
          local_138 = (char *)0x0;
          bVar4 = cmsys::RegularExpression::find
                            (&GetFileInfo::rpathRegex,(char *)local_2d8,
                             (RegularExpressionMatch *)local_1d8);
          if (bVar4) {
            piVar7 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
            cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar7 + -0x18) + (char)piVar7);
            piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               (piVar7,psVar1,cVar5);
            if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
              piVar7 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
              cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar7 + -0x18) + (char)piVar7)
              ;
              piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 (piVar7,psVar1,cVar5);
              if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
                local_298._0_8_ = (char *)0x0;
                local_248 = (char *)0x0;
                local_1f8 = (char *)0x0;
                bVar4 = cmsys::RegularExpression::find
                                  (&GetFileInfo::pathRegex,(char *)local_2d8,
                                   (RegularExpressionMatch *)local_298);
                if (bVar4) {
                  if ((char *)local_298._8_8_ == (char *)0x0) {
                    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                    local_308._M_string_length = 0;
                    local_308.field_2._M_local_buf[0] = '\0';
                  }
                  else {
                    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_308,local_298._8_8_,local_240);
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>(local_1e8,&local_308);
                }
                else {
                  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_308,"Invalid output from otool","");
                  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,&local_308);
                }
                goto LAB_003bc0c6;
              }
            }
            local_298._0_8_ = local_298 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_298,"Invalid output from otool","");
            cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_298);
LAB_003bc3db:
            if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
              operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
            }
            goto LAB_003bc3f5;
          }
          bVar4 = cmsys::RegularExpression::find
                            (&GetFileInfo::loadDylibRegex,(char *)local_2d8,
                             (RegularExpressionMatch *)local_1d8);
        } while (!bVar4);
        piVar7 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
        cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar7 + -0x18) + (char)piVar7);
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar7,psVar1,cVar5)
        ;
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
LAB_003bc3a8:
          local_298._0_8_ = local_298 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Invalid output from otool","");
          cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_298);
          goto LAB_003bc3db;
        }
        piVar7 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_2e0);
        cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar7 + -0x18) + (char)piVar7);
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar7,psVar1,cVar5)
        ;
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_003bc3a8;
        local_298._0_8_ = (char *)0x0;
        local_248 = (char *)0x0;
        local_1f8 = (char *)0x0;
        bVar4 = cmsys::RegularExpression::find
                          (&GetFileInfo::nameRegex,(char *)local_2d8,
                           (RegularExpressionMatch *)local_298);
        if (bVar4) {
          if ((char *)local_298._8_8_ == (char *)0x0) {
            local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
            local_308._M_string_length = 0;
            local_308.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_308,local_298._8_8_,local_240);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_1e0,&local_308);
        }
        else {
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_308,"Invalid output from otool","");
          cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,&local_308);
        }
LAB_003bc0c6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,
                          CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                                   local_308.field_2._M_local_buf[0]) + 1);
        }
      } while (bVar4 != false);
LAB_003bc3f5:
      bVar4 = false;
LAB_003bc3f7:
      if (local_2d8 != (StdioConfiguration)((long)local_2e0 + 0x18)) {
        operator_delete((void *)local_2d8,CONCAT71(uStack_2c7,local_2c8) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Failed to start otool process for:\n  ",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,(file->_M_dataplus)._M_p,file->_M_string_length);
      std::__cxx11::stringbuf::str();
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_298);
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      bVar4 = false;
    }
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_2e0);
    std::
    vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ::~vector(&local_60.Processes);
  }
  else {
    local_1d8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Could not find otool","");
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_2e8,(string *)local_1d8);
    if ((pointer)local_1d8._0_8_ != pcVar2) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    bVar4 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  return bVar4;
}

Assistant:

bool cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& libs,
  std::vector<std::string>& rpaths)
{
  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("otool", command)) {
    this->SetError("Could not find otool");
    return false;
  }
  command.emplace_back("-l");
  command.emplace_back(file);

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression rpathRegex("^ *cmd LC_RPATH$");
  static const cmsys::RegularExpression loadDylibRegex(
    "^ *cmd LC_LOAD_DYLIB$");
  static const cmsys::RegularExpression pathRegex(
    "^ *path (.*) \\(offset [0-9]+\\)$");
  static const cmsys::RegularExpression nameRegex(
    "^ *name (.*) \\(offset [0-9]+\\)$");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch cmdMatch;
    if (rpathRegex.find(line.c_str(), cmdMatch)) {
      if (!std::getline(*process.OutputStream(), line) ||
          !std::getline(*process.OutputStream(), line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch pathMatch;
      if (pathRegex.find(line.c_str(), pathMatch)) {
        rpaths.push_back(pathMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    } else if (loadDylibRegex.find(line.c_str(), cmdMatch)) {
      if (!std::getline(*process.OutputStream(), line) ||
          !std::getline(*process.OutputStream(), line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch nameMatch;
      if (nameRegex.find(line.c_str(), nameMatch)) {
        libs.push_back(nameMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run otool on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}